

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::DumpDictionaryContent
          (DictionaryPrinter *this,TemplateDictionary *dict)

{
  if (dict->variable_dict_ != (VariableDict *)0x0) {
    DumpVariables(this,dict->variable_dict_);
  }
  if (dict->section_dict_ != (SectionDict *)0x0) {
    DumpSectionDict(this,dict->section_dict_);
  }
  if (dict->include_dict_ != (IncludeDict *)0x0) {
    DumpIncludeDict(this,dict->include_dict_);
    return;
  }
  return;
}

Assistant:

void DumpDictionaryContent(const TemplateDictionary& dict) {
    if (dict.variable_dict_) {  // Show variables
      DumpVariables(*dict.variable_dict_);
    }


    if (dict.section_dict_) {  // Show section sub-dictionaries
      DumpSectionDict(*dict.section_dict_);
    }


    if (dict.include_dict_) {  // Show template-include sub-dictionaries
      DumpIncludeDict(*dict.include_dict_);
    }
  }